

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

uint8 * google::protobuf::internal::WireFormat::InternalSerializeWithCachedSizesToArray
                  (Message *message,uint8 *target,EpsCopyOutputStream *stream)

{
  pointer ppFVar1;
  int iVar2;
  undefined4 extraout_var;
  UnknownFieldSet *pUVar4;
  uint8 *puVar5;
  Reflection *this;
  long lVar6;
  int i;
  long lVar7;
  pointer ppFVar8;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_58;
  FieldDescriptor *local_38;
  long lVar3;
  
  iVar2 = (*(message->super_MessageLite)._vptr_MessageLite[0x15])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  (*(message->super_MessageLite)._vptr_MessageLite[0x15])(message);
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (*(char *)(*(long *)(lVar3 + 0x20) + 0x4b) == '\x01') {
    lVar6 = 0;
    for (lVar7 = 0; ppFVar8 = local_58._M_impl.super__Vector_impl_data._M_start,
        ppFVar1 = local_58._M_impl.super__Vector_impl_data._M_finish, lVar7 < *(int *)(lVar3 + 0x68)
        ; lVar7 = lVar7 + 1) {
      local_38 = (FieldDescriptor *)(*(long *)(lVar3 + 0x28) + lVar6);
      std::
      vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
      ::emplace_back<google::protobuf::FieldDescriptor_const*>
                ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                  *)&local_58,&local_38);
      lVar6 = lVar6 + 0x98;
    }
  }
  else {
    Reflection::ListFields
              (this,message,
               (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                *)&local_58);
    ppFVar8 = local_58._M_impl.super__Vector_impl_data._M_start;
    ppFVar1 = local_58._M_impl.super__Vector_impl_data._M_finish;
  }
  for (; ppFVar8 != ppFVar1; ppFVar8 = ppFVar8 + 1) {
    target = InternalSerializeField(*ppFVar8,message,target,stream);
  }
  if (*(char *)(*(long *)(lVar3 + 0x20) + 0x48) == '\x01') {
    pUVar4 = Reflection::GetUnknownFields(this,message);
    puVar5 = InternalSerializeUnknownMessageSetItemsToArray(pUVar4,target,stream);
  }
  else {
    pUVar4 = Reflection::GetUnknownFields(this,message);
    puVar5 = InternalSerializeUnknownFieldsToArray(pUVar4,target,stream);
  }
  std::
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~_Vector_base(&local_58);
  return puVar5;
}

Assistant:

uint8* WireFormat::InternalSerializeWithCachedSizesToArray(
    const Message& message, uint8* target, io::EpsCopyOutputStream* stream) {
  const Descriptor* descriptor = message.GetDescriptor();
  const Reflection* message_reflection = message.GetReflection();

  std::vector<const FieldDescriptor*> fields;

  // Fields of map entry should always be serialized.
  if (descriptor->options().map_entry()) {
    for (int i = 0; i < descriptor->field_count(); i++) {
      fields.push_back(descriptor->field(i));
    }
  } else {
    message_reflection->ListFields(message, &fields);
  }

  for (auto field : fields) {
    target = InternalSerializeField(field, message, target, stream);
  }

  if (descriptor->options().message_set_wire_format()) {
    return InternalSerializeUnknownMessageSetItemsToArray(
        message_reflection->GetUnknownFields(message), target, stream);
  } else {
    return InternalSerializeUnknownFieldsToArray(
        message_reflection->GetUnknownFields(message), target, stream);
  }
}